

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_k_means_test.cc
# Opt level: O0

void __thiscall
AV1Kmeans::AV1KmeansTest2_DISABLED_Speed_Test::TestBody(AV1KmeansTest2_DISABLED_Speed_Test *this)

{
  int in_stack_00000030;
  BLOCK_SIZE_conflict in_stack_00000037;
  av1_calc_indices_dim2_func in_stack_00000038;
  
  testing::
  WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::get<0ul,void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
              *)0x9ed270);
  testing::
  WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::get<1ul,void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
              *)0x9ed284);
  AV1KmeansTest2::RunSpeedTest
            (&this->super_AV1KmeansTest2,in_stack_00000038,in_stack_00000037,in_stack_00000030);
  testing::
  WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::get<0ul,void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
              *)0x9ed2a7);
  testing::
  WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::get<1ul,void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
              *)0x9ed2bc);
  AV1KmeansTest2::RunSpeedTest
            (&this->super_AV1KmeansTest2,in_stack_00000038,in_stack_00000037,in_stack_00000030);
  testing::
  WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::get<0ul,void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
              *)0x9ed2e0);
  testing::
  WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::get<1ul,void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
              *)0x9ed2f5);
  AV1KmeansTest2::RunSpeedTest
            (&this->super_AV1KmeansTest2,in_stack_00000038,in_stack_00000037,in_stack_00000030);
  testing::
  WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::get<0ul,void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
              *)0x9ed319);
  testing::
  WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::get<1ul,void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
              *)0x9ed32e);
  AV1KmeansTest2::RunSpeedTest
            (&this->super_AV1KmeansTest2,in_stack_00000038,in_stack_00000037,in_stack_00000030);
  testing::
  WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::get<0ul,void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
              *)0x9ed352);
  testing::
  WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::get<1ul,void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
              *)0x9ed367);
  AV1KmeansTest2::RunSpeedTest
            (&this->super_AV1KmeansTest2,in_stack_00000038,in_stack_00000037,in_stack_00000030);
  testing::
  WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::get<0ul,void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
              *)0x9ed38b);
  testing::
  WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::get<1ul,void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
              *)0x9ed3a0);
  AV1KmeansTest2::RunSpeedTest
            (&this->super_AV1KmeansTest2,in_stack_00000038,in_stack_00000037,in_stack_00000030);
  testing::
  WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::get<0ul,void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
              *)0x9ed3c4);
  testing::
  WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::get<1ul,void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
              *)0x9ed3d9);
  AV1KmeansTest2::RunSpeedTest
            (&this->super_AV1KmeansTest2,in_stack_00000038,in_stack_00000037,in_stack_00000030);
  return;
}

Assistant:

TEST_P(AV1KmeansTest2, DISABLED_Speed) {
  RunSpeedTest(GET_PARAM(0), GET_PARAM(1), 2);
  RunSpeedTest(GET_PARAM(0), GET_PARAM(1), 3);
  RunSpeedTest(GET_PARAM(0), GET_PARAM(1), 4);
  RunSpeedTest(GET_PARAM(0), GET_PARAM(1), 5);
  RunSpeedTest(GET_PARAM(0), GET_PARAM(1), 6);
  RunSpeedTest(GET_PARAM(0), GET_PARAM(1), 7);
  RunSpeedTest(GET_PARAM(0), GET_PARAM(1), 8);
}